

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)

{
  sxu32 nByte_00;
  unqlite *puVar1;
  unqlite *pDb_00;
  _func_int_unqlite_kv_engine_ptr_int *p_Var2;
  int iVar3;
  unqlite_kv_engine *pSrc;
  unqlite_kv_io *pIo_00;
  int local_48;
  int rc;
  sxu32 nByte;
  unqlite_kv_io *pIo;
  unqlite_kv_engine *pEngine;
  unqlite *pDb;
  unqlite_db *pStorage;
  unqlite_kv_methods *pMethods_local;
  Pager *pPager_local;
  
  puVar1 = pPager->pDb;
  pDb_00 = pPager->pDb;
  if (pPager->pEngine != (unqlite_kv_engine *)0x0) {
    if (pMethods == pPager->pEngine->pIo->pMethods) {
      return 0;
    }
    pager_release_kv_engine(pPager);
  }
  nByte_00 = pMethods->szKv;
  pSrc = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb_00->sMem,nByte_00);
  if (pSrc == (unqlite_kv_engine *)0x0) {
    unqliteGenOutofMem(pDb_00);
    return -1;
  }
  pIo_00 = (unqlite_kv_io *)SyMemBackendAlloc(&pDb_00->sMem,0x88);
  if (pIo_00 == (unqlite_kv_io *)0x0) {
    SyMemBackendFree(&pDb_00->sMem,pSrc);
    unqliteGenOutofMem(pDb_00);
    return -1;
  }
  SyZero(pIo_00,0x58);
  SyZero(pSrc,nByte_00);
  pager_kv_io_init(pPager,pMethods,pIo_00);
  pSrc->pIo = pIo_00;
  if (pMethods->xInit != (_func_int_unqlite_kv_engine_ptr_int *)0x0) {
    p_Var2 = pMethods->xInit;
    iVar3 = unqliteGetPageSize();
    local_48 = (*p_Var2)(pSrc,iVar3);
    if (local_48 != 0) {
      unqliteGenErrorFormat
                (pDb_00,"xInit() method of the underlying KV engine \'%z\' failed",&pPager->sKv);
      goto LAB_0011d59e;
    }
    pSrc->pIo = pIo_00;
  }
  pPager->pEngine = pSrc;
  local_48 = unqliteInitCursor(pDb_00,&(puVar1->sDB).pCursor);
  if (local_48 == 0) {
    return 0;
  }
LAB_0011d59e:
  SyMemBackendFree(&pDb_00->sMem,pSrc);
  SyMemBackendFree(&pDb_00->sMem,pIo_00);
  return local_48;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)
{
	unqlite_db *pStorage = &pPager->pDb->sDB;
	unqlite *pDb = pPager->pDb;
	unqlite_kv_engine *pEngine;
	unqlite_kv_io *pIo;
	sxu32 nByte;
	int rc;
	if( pPager->pEngine ){
		if( pMethods == pPager->pEngine->pIo->pMethods ){
			/* Ticket 1432: Same implementation */
			return UNQLITE_OK;
		}
		/* Release the old KV engine */
		pager_release_kv_engine(pPager);
	}
	/* Allocate a new KV engine instance */
	nByte = (sxu32)pMethods->szKv;
	pEngine = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb->sMem,nByte);
	if( pEngine == 0 ){
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	pIo = (unqlite_kv_io *)SyMemBackendAlloc(&pDb->sMem,sizeof(unqlite_kv_io));
	if( pIo == 0 ){
		SyMemBackendFree(&pDb->sMem,pEngine);
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pIo,sizeof(unqlite_io_methods));
	SyZero(pEngine,nByte);
	/* Populate the IO structure */
	pager_kv_io_init(pPager,pMethods,pIo);
	pEngine->pIo = pIo;
	/* Invoke the init callback if avaialble */
	if( pMethods->xInit ){
		rc = pMethods->xInit(pEngine,unqliteGetPageSize());
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,
				"xInit() method of the underlying KV engine '%z' failed",&pPager->sKv);
			goto fail;
		}
		pEngine->pIo = pIo;
	}
	pPager->pEngine = pEngine;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pStorage->pCursor);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	return UNQLITE_OK;
fail:
	SyMemBackendFree(&pDb->sMem,pEngine);
	SyMemBackendFree(&pDb->sMem,pIo);
	return rc;
}